

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort_seq.hpp
# Opt level: O0

void burst::
     radix_sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::to_ordered_integral_fn,burst::low_byte_fn>
               (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                first,__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                      last,undefined8 buffer)

{
  undefined8 uVar1;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> _Var2;
  int iVar3;
  difference_type dVar4;
  to_ordered_integral_fn *r;
  shift_to_unsigned_fn *l;
  burst local_21;
  undefined8 local_20;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  buffer_local;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  last_local;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  first_local;
  
  local_20 = buffer;
  buffer_local._M_current = last._M_current;
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
                    (first,last);
  iVar3 = std::numeric_limits<int>::max();
  _Var2 = buffer_local;
  uVar1 = local_20;
  r = (to_ordered_integral_fn *)(long)iVar3;
  if ((long)r < dVar4) {
    compose<burst::shift_to_unsigned_fn_const&,burst::to_ordered_integral_fn>
              ((compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
               &shift_to_unsigned,&local_21,l,r);
    detail::
    radix_sort_impl<long,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn>
              ((detail *)first._M_current,_Var2._M_current,uVar1);
  }
  else {
    compose<burst::shift_to_unsigned_fn_const&,burst::to_ordered_integral_fn>
              ((compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
               &shift_to_unsigned,&local_21,l,r);
    detail::
    radix_sort_impl<int,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn>
              ((detail *)first._M_current,_Var2._M_current,uVar1);
  }
  return;
}

Assistant:

void
        radix_sort
        (
            RandomAccessIterator1 first,
            RandomAccessIterator1 last,
            RandomAccessIterator2 buffer,
            Map map,
            Radix radix
        )
    {
        using difference_type = iterator_difference_t<RandomAccessIterator1>;
        using min_type =
            typename std::conditional
            <
                sizeof(std::int32_t) < sizeof(difference_type),
                std::int32_t,
                difference_type
            >
            ::type;

        using std::distance;
        if (distance(first, last) <= std::numeric_limits<min_type>::max())
        {
            detail::radix_sort_impl<min_type>
            (
                first,
                last,
                buffer,
                compose(shift_to_unsigned, std::move(map)),
                radix
            );
        }
        else
        {
            detail::radix_sort_impl<difference_type>
            (
                first,
                last,
                buffer,
                compose(shift_to_unsigned, std::move(map)),
                radix
            );
        }
    }